

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week11-hw.cpp
# Opt level: O0

void print<int>(int *value)

{
  ostream *this;
  int *value_local;
  
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*value);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print(const T& value)
{
    if constexpr(IsContainer<T>)
    {
        for(const auto& item : value)
            std::cout << "[" << item << "]";
        std::cout << std::endl;
    }
    else
    {
        std::cout << value << std::endl;
    }
}